

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall c4::yml::Tree::resolve_tag(Tree *this,substr output,csubstr tag,size_t node_id)

{
  ulong start;
  char cVar1;
  char *pcVar2;
  pfn_error p_Var3;
  size_t sVar4;
  code *pcVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  Location LVar13;
  Location LVar14;
  Location LVar15;
  Location LVar16;
  bool bVar17;
  size_t sVar18;
  size_t sVar19;
  ulong uVar20;
  long lVar21;
  byte bVar22;
  char *pcVar23;
  ulong uVar24;
  char cVar25;
  long lVar26;
  ulong uVar27;
  ro_substr pattern;
  ro_substr chars;
  ro_substr chars_00;
  csubstr cVar28;
  csubstr rest;
  char msg [41];
  long local_218;
  csubstr tag_local;
  char *pcStack_1d0;
  size_t local_1c8;
  char *pcStack_1a8;
  size_t local_1a0;
  char *pcStack_180;
  size_t local_178;
  char *pcStack_158;
  size_t local_150;
  char *pcStack_130;
  size_t local_128;
  char *pcStack_108;
  size_t local_100;
  char *pcStack_e0;
  size_t local_d8;
  char *pcStack_b8;
  size_t local_b0;
  char *pcStack_90;
  size_t local_88;
  char *pcStack_68;
  size_t local_60;
  char *pcStack_40;
  size_t local_38;
  
  tag_local.len = tag.len;
  tag_local.str = tag.str;
  pcVar23 = output.str;
  lVar26 = 0xf8;
  while( true ) {
    if (lVar26 == 0x58) {
      return 0;
    }
    pcVar2 = *(char **)((long)this->m_tag_directives + lVar26 + -0x80);
    sVar18 = *(size_t *)((long)(this->m_tag_directives + -3) + lVar26);
    if (((pcVar2 != (char *)0x0 && sVar18 != 0) &&
        (pattern.len = sVar18, pattern.str = pcVar2,
        bVar17 = basic_substring<const_char>::begins_with(&tag_local,pattern), bVar17)) &&
       (*(ulong *)((long)this->m_tag_directives + lVar26 + -0x60) <= node_id)) break;
    lVar26 = lVar26 + -0x28;
  }
  uVar20 = *(ulong *)((long)(this->m_tag_directives + -3) + lVar26);
  if (tag_local.len < uVar20) {
    builtin_strncpy(msg + 0x20,"dle.len)",9);
    builtin_strncpy(msg,"check failed: (tag.len >= td.han",0x20);
    if ((((byte)s_error_flags & 1) != 0) && (bVar17 = is_debugger_attached(), bVar17)) {
      pcVar5 = (code *)swi(3);
      sVar18 = (*pcVar5)();
      return sVar18;
    }
    p_Var3 = (this->m_callbacks).m_error;
    cVar28 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_38 = cVar28.len;
    pcStack_40 = cVar28.str;
    LVar6.super_LineCol.col = 0;
    LVar6.super_LineCol.offset = SUB168(ZEXT816(0x682c) << 0x40,0);
    LVar6.super_LineCol.line = SUB168(ZEXT816(0x682c) << 0x40,8);
    LVar6.name.str = pcStack_40;
    LVar6.name.len = local_38;
    (*p_Var3)(msg,0x29,LVar6,(this->m_callbacks).m_user_data);
    uVar20 = *(ulong *)((long)(this->m_tag_directives + -3) + lVar26);
  }
  if (tag_local.len < uVar20) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar17 = is_debugger_attached(), bVar17)) {
      pcVar5 = (code *)swi(3);
      sVar18 = (*pcVar5)();
      return sVar18;
    }
    handle_error(0x22b919,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1533,"first >= 0 && first <= len");
  }
  basic_substring<const_char>::basic_substring
            ((basic_substring<const_char> *)msg,tag_local.str + uVar20,tag_local.len - uVar20);
  rest.len = CONCAT26(msg._14_2_,CONCAT24(msg._12_2_,CONCAT13(msg[0xb],CONCAT21(msg._9_2_,msg[8]))))
  ;
  rest.str = (char *)msg._0_8_;
  uVar20 = rest.len + 2 + *(long *)((long)this->m_tag_directives + lVar26 + -0x68);
  sVar18 = basic_substring<const_char>::count(&rest,'%',0);
  if (sVar18 == 0) {
    if (output.len < uVar20) {
      return uVar20;
    }
    *pcVar23 = '<';
    memcpy(pcVar23 + 1,*(void **)((long)this->m_tag_directives + lVar26 + -0x70),
           *(size_t *)((long)this->m_tag_directives + lVar26 + -0x68));
    sVar18 = rest.len;
    memcpy(pcVar23 + 1 + *(long *)((long)this->m_tag_directives + lVar26 + -0x68),rest.str,rest.len)
    ;
    pcVar23[sVar18 + 1 + *(long *)((long)this->m_tag_directives + lVar26 + -0x68)] = '>';
    return uVar20;
  }
  sVar18 = basic_substring<const_char>::first_of(&rest,'%',0);
  if (sVar18 == 0xffffffffffffffff) {
    builtin_strncpy(msg,"check failed: (pos != npos)",0x1c);
    if ((((byte)s_error_flags & 1) != 0) && (bVar17 = is_debugger_attached(), bVar17)) {
      pcVar5 = (code *)swi(3);
      sVar18 = (*pcVar5)();
      return sVar18;
    }
    p_Var3 = (this->m_callbacks).m_error;
    cVar28 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_60 = cVar28.len;
    pcStack_68 = cVar28.str;
    LVar7.super_LineCol.col = 0;
    LVar7.super_LineCol.offset = SUB168(ZEXT816(0x683e) << 0x40,0);
    LVar7.super_LineCol.line = SUB168(ZEXT816(0x683e) << 0x40,8);
    LVar7.name.str = pcStack_68;
    LVar7.name.len = local_60;
    (*p_Var3)(msg,0x1c,LVar7,(this->m_callbacks).m_user_data);
  }
  do {
    uVar24 = sVar18 + 1;
    chars.len = 0x16;
    chars.str = "0123456789abcdefABCDEF";
    sVar19 = basic_substring<const_char>::first_not_of(&rest,chars,uVar24);
    if (sVar19 == 0xffffffffffffffff) {
      sVar19 = rest.len;
    }
    if (sVar19 <= uVar24) {
      builtin_strncpy(msg,"check failed: pos+1 < next",0x1b);
      if ((((byte)s_error_flags & 1) != 0) && (bVar17 = is_debugger_attached(), bVar17)) {
        pcVar5 = (code *)swi(3);
        sVar18 = (*pcVar5)();
        return sVar18;
      }
      p_Var3 = (this->m_callbacks).m_error;
      cVar28 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_88 = cVar28.len;
      pcStack_90 = cVar28.str;
      LVar8.super_LineCol.col = 0;
      LVar8.super_LineCol.offset = SUB168(ZEXT816(0x6843) << 0x40,0);
      LVar8.super_LineCol.line = SUB168(ZEXT816(0x6843) << 0x40,8);
      LVar8.name.str = pcStack_90;
      LVar8.name.len = local_88;
      (*p_Var3)(msg,0x1b,LVar8,(this->m_callbacks).m_user_data);
    }
    if (sVar19 < sVar18 + 3) {
      builtin_strncpy(msg,"check failed: pos+1 + 2 <= next",0x20);
      if ((((byte)s_error_flags & 1) != 0) && (bVar17 = is_debugger_attached(), bVar17)) {
        pcVar5 = (code *)swi(3);
        sVar18 = (*pcVar5)();
        return sVar18;
      }
      p_Var3 = (this->m_callbacks).m_error;
      cVar28 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_b0 = cVar28.len;
      pcStack_b8 = cVar28.str;
      LVar9.super_LineCol.col = 0;
      LVar9.super_LineCol.offset = SUB168(ZEXT816(0x6844) << 0x40,0);
      LVar9.super_LineCol.line = SUB168(ZEXT816(0x6844) << 0x40,8);
      LVar9.name.str = pcStack_b8;
      LVar9.name.len = local_b0;
      (*p_Var3)(msg,0x20,LVar9,(this->m_callbacks).m_user_data);
    }
    uVar20 = uVar20 + (uVar24 - sVar19);
    sVar18 = basic_substring<const_char>::first_of(&rest,'%',uVar24);
  } while (sVar18 != 0xffffffffffffffff);
  if (output.len < uVar20) {
    return uVar20;
  }
  *pcVar23 = '<';
  sVar4 = *(size_t *)((long)this->m_tag_directives + lVar26 + -0x68);
  memcpy(pcVar23 + 1,*(void **)((long)this->m_tag_directives + lVar26 + -0x70),sVar4);
  sVar18 = basic_substring<const_char>::first_of(&rest,'%',0);
  if (sVar18 == 0xffffffffffffffff) {
    builtin_strncpy(msg,"check failed: (pos != npos)",0x1c);
    if ((((byte)s_error_flags & 1) != 0) && (bVar17 = is_debugger_attached(), bVar17)) {
      pcVar5 = (code *)swi(3);
      sVar18 = (*pcVar5)();
      return sVar18;
    }
    p_Var3 = (this->m_callbacks).m_error;
    cVar28 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_d8 = cVar28.len;
    pcStack_e0 = cVar28.str;
    LVar10.super_LineCol.col = 0;
    LVar10.super_LineCol.offset = SUB168(ZEXT816(0x6851) << 0x40,0);
    LVar10.super_LineCol.line = SUB168(ZEXT816(0x6851) << 0x40,8);
    LVar10.name.str = pcStack_e0;
    LVar10.name.len = local_d8;
    (*p_Var3)(msg,0x1c,LVar10,(this->m_callbacks).m_user_data);
  }
  local_218 = sVar4 + 1;
  uVar24 = 0;
  do {
    start = sVar18 + 1;
    chars_00.len = 0x16;
    chars_00.str = "0123456789abcdefABCDEF";
    sVar19 = basic_substring<const_char>::first_not_of(&rest,chars_00,start);
    if (sVar19 == 0xffffffffffffffff) {
      sVar19 = rest.len;
    }
    if (sVar19 <= start) {
      builtin_strncpy(msg,"check failed: pos+1 < next",0x1b);
      if ((((byte)s_error_flags & 1) != 0) && (bVar17 = is_debugger_attached(), bVar17)) {
        pcVar5 = (code *)swi(3);
        sVar18 = (*pcVar5)();
        return sVar18;
      }
      p_Var3 = (this->m_callbacks).m_error;
      cVar28 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_100 = cVar28.len;
      pcStack_108 = cVar28.str;
      LVar11.super_LineCol.col = 0;
      LVar11.super_LineCol.offset = SUB168(ZEXT816(0x6856) << 0x40,0);
      LVar11.super_LineCol.line = SUB168(ZEXT816(0x6856) << 0x40,8);
      LVar11.name.str = pcStack_108;
      LVar11.name.len = local_100;
      (*p_Var3)(msg,0x1b,LVar11,(this->m_callbacks).m_user_data);
    }
    if (sVar19 < sVar18 + 3) {
      builtin_strncpy(msg,"check failed: pos+1 + 2 <= next",0x20);
      if ((((byte)s_error_flags & 1) != 0) && (bVar17 = is_debugger_attached(), bVar17)) {
        pcVar5 = (code *)swi(3);
        sVar18 = (*pcVar5)();
        return sVar18;
      }
      p_Var3 = (this->m_callbacks).m_error;
      cVar28 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_128 = cVar28.len;
      pcStack_130 = cVar28.str;
      LVar12.super_LineCol.col = 0;
      LVar12.super_LineCol.offset = SUB168(ZEXT816(0x6857) << 0x40,0);
      LVar12.super_LineCol.line = SUB168(ZEXT816(0x6857) << 0x40,8);
      LVar12.name.str = pcStack_130;
      LVar12.name.len = local_128;
      (*p_Var3)(msg,0x20,LVar12,(this->m_callbacks).m_user_data);
    }
    if (rest.len < start) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar17 = is_debugger_attached(), bVar17)) {
        pcVar5 = (code *)swi(3);
        sVar18 = (*pcVar5)();
        return sVar18;
      }
      handle_error(0x22b919,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1544,"first >= 0 && first <= len");
    }
    uVar27 = sVar19;
    if (sVar19 == 0xffffffffffffffff) {
      uVar27 = rest.len;
    }
    if (uVar27 < start) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar17 = is_debugger_attached(), bVar17)) {
        pcVar5 = (code *)swi(3);
        sVar18 = (*pcVar5)();
        return sVar18;
      }
      handle_error(0x22b919,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1546,"first <= last");
    }
    if (rest.len < uVar27) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar17 = is_debugger_attached(), bVar17)) {
        pcVar5 = (code *)swi(3);
        sVar18 = (*pcVar5)();
        return sVar18;
      }
      handle_error(0x22b919,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1547,"last >= 0 && last <= len");
    }
    basic_substring<const_char>::basic_substring
              ((basic_substring<const_char> *)msg,rest.str + start,uVar27 - start);
    lVar26 = CONCAT26(msg._14_2_,CONCAT24(msg._12_2_,CONCAT13(msg[0xb],CONCAT21(msg._9_2_,msg[8]))))
    ;
    if ((lVar26 == 0) || (msg._0_8_ == 0)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar17 = is_debugger_attached(), bVar17)) {
        pcVar5 = (code *)swi(3);
        sVar18 = (*pcVar5)();
        return sVar18;
      }
      handle_error(0x22b919,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x2cac,"!s.empty()");
    }
    cVar25 = '\0';
    for (lVar21 = 0; lVar26 != lVar21; lVar21 = lVar21 + 1) {
      cVar1 = *(char *)(msg._0_8_ + lVar21);
      bVar22 = cVar1 - 0x30;
      if (9 < bVar22) {
        if ((byte)(cVar1 + 0x9fU) < 6) {
          bVar22 = cVar1 + 0xa9;
        }
        else {
          if (5 < (byte)(cVar1 + 0xbfU)) goto LAB_001fcd1c;
          bVar22 = cVar1 - 0x37;
        }
      }
      cVar25 = cVar25 * '\x10' + bVar22;
    }
    if (cVar25 < '\0') {
LAB_001fcd1c:
      builtin_strncpy(msg,"invalid URI character",0x16);
      if ((((byte)s_error_flags & 1) != 0) && (bVar17 = is_debugger_attached(), bVar17)) {
        pcVar5 = (code *)swi(3);
        sVar18 = (*pcVar5)();
        return sVar18;
      }
      p_Var3 = (this->m_callbacks).m_error;
      cVar28 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_150 = cVar28.len;
      pcStack_158 = cVar28.str;
      LVar13.super_LineCol.col = 0;
      LVar13.super_LineCol.offset = SUB168(ZEXT816(0x685a) << 0x40,0);
      LVar13.super_LineCol.line = SUB168(ZEXT816(0x685a) << 0x40,8);
      LVar13.name.str = pcStack_158;
      LVar13.name.len = local_150;
      (*p_Var3)(msg,0x16,LVar13,(this->m_callbacks).m_user_data);
    }
    if (rest.len < uVar24) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar17 = is_debugger_attached(), bVar17)) {
        pcVar5 = (code *)swi(3);
        sVar18 = (*pcVar5)();
        return sVar18;
      }
      handle_error(0x22b919,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1544,"first >= 0 && first <= len");
    }
    if (sVar18 == 0xffffffffffffffff) {
      sVar18 = rest.len;
    }
    if (sVar18 < uVar24) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar17 = is_debugger_attached(), bVar17)) {
        pcVar5 = (code *)swi(3);
        sVar18 = (*pcVar5)();
        return sVar18;
      }
      handle_error(0x22b919,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1546,"first <= last");
    }
    if (rest.len < sVar18) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar17 = is_debugger_attached(), bVar17)) {
        pcVar5 = (code *)swi(3);
        sVar18 = (*pcVar5)();
        return sVar18;
      }
      handle_error(0x22b919,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1547,"last >= 0 && last <= len");
    }
    basic_substring<const_char>::basic_substring
              ((basic_substring<const_char> *)msg,rest.str + uVar24,sVar18 - uVar24);
    sVar4 = CONCAT26(msg._14_2_,CONCAT24(msg._12_2_,CONCAT13(msg[0xb],CONCAT21(msg._9_2_,msg[8]))));
    memcpy(pcVar23 + local_218,(void *)msg._0_8_,sVar4);
    lVar26 = sVar4 + local_218;
    local_218 = local_218 + sVar4 + 1;
    pcVar23[lVar26] = cVar25;
    sVar18 = basic_substring<const_char>::first_of(&rest,'%',start);
    uVar24 = sVar19;
    if (sVar18 == 0xffffffffffffffff) {
      if (sVar19 == 0) {
        builtin_strncpy(msg,"check failed: (prev > 0)",0x19);
        if ((((byte)s_error_flags & 1) != 0) && (bVar17 = is_debugger_attached(), bVar17)) {
          pcVar5 = (code *)swi(3);
          sVar18 = (*pcVar5)();
          return sVar18;
        }
        p_Var3 = (this->m_callbacks).m_error;
        cVar28 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_178 = cVar28.len;
        pcStack_180 = cVar28.str;
        LVar14.super_LineCol.col = 0;
        LVar14.super_LineCol.offset = SUB168(ZEXT816(0x6861) << 0x40,0);
        LVar14.super_LineCol.line = SUB168(ZEXT816(0x6861) << 0x40,8);
        LVar14.name.str = pcStack_180;
        LVar14.name.len = local_178;
        (*p_Var3)(msg,0x19,LVar14,(this->m_callbacks).m_user_data);
      }
      if (rest.len < sVar19) {
        builtin_strncpy(msg,"check failed: (rest.len >= prev)",0x21);
        if ((((byte)s_error_flags & 1) != 0) && (bVar17 = is_debugger_attached(), bVar17)) {
          pcVar5 = (code *)swi(3);
          sVar18 = (*pcVar5)();
          return sVar18;
        }
        p_Var3 = (this->m_callbacks).m_error;
        cVar28 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_1a0 = cVar28.len;
        pcStack_1a8 = cVar28.str;
        LVar15.super_LineCol.col = 0;
        LVar15.super_LineCol.offset = SUB168(ZEXT816(0x6862) << 0x40,0);
        LVar15.super_LineCol.line = SUB168(ZEXT816(0x6862) << 0x40,8);
        LVar15.name.str = pcStack_1a8;
        LVar15.name.len = local_1a0;
        (*p_Var3)(msg,0x21,LVar15,(this->m_callbacks).m_user_data);
      }
      if (sVar19 <= rest.len) {
        basic_substring<const_char>::basic_substring
                  ((basic_substring<const_char> *)msg,rest.str + sVar19,rest.len - sVar19);
        sVar4 = CONCAT26(msg._14_2_,
                         CONCAT24(msg._12_2_,CONCAT13(msg[0xb],CONCAT21(msg._9_2_,msg[8]))));
        memcpy(pcVar23 + local_218,(void *)msg._0_8_,sVar4);
        pcVar23[sVar4 + local_218] = '>';
        if (sVar4 + local_218 + 1 == uVar20) {
          return uVar20;
        }
        builtin_strncpy(msg,"check failed: (wpos == len)",0x1c);
        if ((((byte)s_error_flags & 1) != 0) && (bVar17 = is_debugger_attached(), bVar17)) {
          pcVar5 = (code *)swi(3);
          sVar18 = (*pcVar5)();
          return sVar18;
        }
        p_Var3 = (this->m_callbacks).m_error;
        cVar28 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_1c8 = cVar28.len;
        pcStack_1d0 = cVar28.str;
        LVar16.super_LineCol.col = 0;
        LVar16.super_LineCol.offset = SUB168(ZEXT816(0x6865) << 0x40,0);
        LVar16.super_LineCol.line = SUB168(ZEXT816(0x6865) << 0x40,8);
        LVar16.name.str = pcStack_1d0;
        LVar16.name.len = local_1c8;
        (*p_Var3)(msg,0x1c,LVar16,(this->m_callbacks).m_user_data);
        return uVar20;
      }
      if ((((byte)s_error_flags & 1) != 0) && (bVar17 = is_debugger_attached(), bVar17)) {
        pcVar5 = (code *)swi(3);
        sVar18 = (*pcVar5)();
        return sVar18;
      }
      handle_error(0x22b919,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
  } while( true );
}

Assistant:

size_t Tree::resolve_tag(substr output, csubstr tag, size_t node_id) const
{
    // lookup from the end. We want to find the first directive that
    // matches the tag and has a target node id leq than the given
    // node_id.
    for(size_t i = RYML_MAX_TAG_DIRECTIVES-1; i != (size_t)-1; --i)
    {
        auto const& td = m_tag_directives[i];
        if(td.handle.empty())
            continue;
        if(tag.begins_with(td.handle) && td.next_node_id <= node_id)
        {
            _RYML_CB_ASSERT(m_callbacks, tag.len >= td.handle.len);
            csubstr rest = tag.sub(td.handle.len);
            size_t len = 1u + td.prefix.len + rest.len + 1u;
            size_t numpc = rest.count('%');
            if(numpc == 0)
            {
                if(len <= output.len)
                {
                    output.str[0] = '<';
                    memcpy(1u + output.str, td.prefix.str, td.prefix.len);
                    memcpy(1u + output.str + td.prefix.len, rest.str, rest.len);
                    output.str[1u + td.prefix.len + rest.len] = '>';
                }
            }
            else
            {
                // need to decode URI % sequences
                size_t pos = rest.find('%');
                _RYML_CB_ASSERT(m_callbacks, pos != npos);
                do {
                    size_t next = rest.first_not_of("0123456789abcdefABCDEF", pos+1);
                    if(next == npos)
                        next = rest.len;
                    _RYML_CB_CHECK(m_callbacks, pos+1 < next);
                    _RYML_CB_CHECK(m_callbacks, pos+1 + 2 <= next);
                    size_t delta = next - (pos+1);
                    len -= delta;
                    pos = rest.find('%', pos+1);
                } while(pos != npos);
                if(len <= output.len)
                {
                    size_t prev = 0, wpos = 0;
                    auto appendstr = [&](csubstr s) { memcpy(output.str + wpos, s.str, s.len); wpos += s.len; };
                    auto appendchar = [&](char c) { output.str[wpos++] = c; };
                    appendchar('<');
                    appendstr(td.prefix);
                    pos = rest.find('%');
                    _RYML_CB_ASSERT(m_callbacks, pos != npos);
                    do {
                        size_t next = rest.first_not_of("0123456789abcdefABCDEF", pos+1);
                        if(next == npos)
                            next = rest.len;
                        _RYML_CB_CHECK(m_callbacks, pos+1 < next);
                        _RYML_CB_CHECK(m_callbacks, pos+1 + 2 <= next);
                        uint8_t val;
                        if(C4_UNLIKELY(!read_hex(rest.range(pos+1, next), &val) || val > 127))
                            _RYML_CB_ERR(m_callbacks, "invalid URI character");
                        appendstr(rest.range(prev, pos));
                        appendchar((char)val);
                        prev = next;
                        pos = rest.find('%', pos+1);
                    } while(pos != npos);
                    _RYML_CB_ASSERT(m_callbacks, pos == npos);
                    _RYML_CB_ASSERT(m_callbacks, prev > 0);
                    _RYML_CB_ASSERT(m_callbacks, rest.len >= prev);
                    appendstr(rest.sub(prev));
                    appendchar('>');
                    _RYML_CB_ASSERT(m_callbacks, wpos == len);
                }
            }
            return len;
        }
    }
    return 0; // return 0 to signal that the tag is local and cannot be resolved
}